

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O3

UINT8 CPConv_Init(CPCONV **retCPC,char *cpFrom,char *cpTo)

{
  UINT8 UVar1;
  CPCONV *pCVar2;
  char *__fromcode;
  char *__tocode;
  iconv_t pvVar3;
  
  pCVar2 = (CPCONV *)calloc(1,0x18);
  if (pCVar2 == (CPCONV *)0x0) {
    UVar1 = 0xff;
  }
  else {
    __fromcode = strdup(cpFrom);
    pCVar2->cpFrom = __fromcode;
    __tocode = strdup(cpTo);
    pCVar2->cpTo = __tocode;
    pvVar3 = iconv_open(__tocode,__fromcode);
    pCVar2->hIConv = pvVar3;
    if (pvVar3 == (iconv_t)0xffffffffffffffff) {
      free(__fromcode);
      free(__tocode);
      UVar1 = 0x80;
    }
    else {
      *retCPC = pCVar2;
      UVar1 = '\0';
    }
  }
  return UVar1;
}

Assistant:

UINT8 CPConv_Init(CPCONV** retCPC, const char* cpFrom, const char* cpTo)
{
	CPCONV* cpc;
	
	cpc = (CPCONV*)calloc(1, sizeof(CPCONV));
	if (cpc == NULL)
		return 0xFF;
	
	cpc->cpFrom = strdup(cpFrom);
	cpc->cpTo = strdup(cpTo);
	cpc->hIConv = iconv_open(cpc->cpTo, cpc->cpFrom);
	if (cpc->hIConv == (iconv_t)-1)
	{
		free(cpc->cpFrom);
		free(cpc->cpTo);
		return 0x80;
	}
	
	*retCPC = cpc;
	return 0x00;
}